

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOReadFmsFieldDescriptor
              (FmsIOContext *ctx,FmsIOFunctions *io,char *key,FmsIOFieldDescriptorInfo *fd_info)

{
  char *pcVar1;
  long in_RCX;
  long in_RSI;
  undefined8 in_RDI;
  char *kndofs;
  FmsInt n;
  FmsIntType type;
  char *kfo;
  FmsInt fdt;
  char *kfd_type;
  char *kcomp_name;
  char *kfd_name;
  int err;
  char *in_stack_ffffffffffffff98;
  long lVar2;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined8 local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  int local_2c;
  long local_28;
  long local_18;
  undefined8 local_10;
  int local_4;
  
  local_2c = 0;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_38 = join_keys((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
  local_2c = (**(code **)(local_18 + 0x78))(local_10,local_38,local_28);
  if (local_38 != (char *)0x0) {
    free(local_38);
  }
  if (local_2c == 0) {
    local_40 = join_keys((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
    local_2c = (**(code **)(local_18 + 0x78))(local_10,local_40,local_28 + 8);
    if (local_40 != (char *)0x0) {
      free(local_40);
    }
    if (local_2c == 0) {
      local_48 = join_keys((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98);
      local_50 = 0;
      local_2c = (**(code **)(local_18 + 0x50))(local_10,local_48,&local_50);
      if (local_48 != (char *)0x0) {
        free(local_48);
      }
      if (local_2c == 0) {
        *(int *)(local_28 + 0x10) = (int)local_50;
        pcVar1 = join_keys((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98);
        lVar2 = 0;
        local_2c = (**(code **)(local_18 + 0x58))
                             (local_10,pcVar1,&stack0xffffffffffffffa4,local_28 + 0x18,
                              &stack0xffffffffffffff98);
        if (pcVar1 != (char *)0x0) {
          free(pcVar1);
        }
        if (((local_2c == 0) && (in_stack_ffffffffffffffa4 == 7)) && (lVar2 == 3)) {
          pcVar1 = join_keys((char *)CONCAT44(7,in_stack_ffffffffffffffa0),(char *)0x3);
          local_2c = (**(code **)(local_18 + 0x50))(local_10,pcVar1,local_28 + 0x20);
          if (pcVar1 != (char *)0x0) {
            free(pcVar1);
          }
          if (local_2c == 0) {
            local_4 = 0;
          }
          else {
            local_4 = 5;
          }
        }
        else {
          local_4 = 4;
        }
      }
      else {
        local_4 = 3;
      }
    }
    else {
      local_4 = 2;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
FmsIOReadFmsFieldDescriptor(FmsIOContext *ctx, FmsIOFunctions *io,
                            const char *key, FmsIOFieldDescriptorInfo *fd_info) {
  int err = 0;

  // Get the fd's name
  {
    char *kfd_name = join_keys(key, "Name");
    err = (*io->get_string)(ctx, kfd_name, &fd_info->name);
    FREE(kfd_name);
    if(err)
      E_RETURN(1);
  }

  // Get which compoenent the fd refers to
  {
    char *kcomp_name = join_keys(key, "ComponentName");
    err = (*io->get_string)(ctx, kcomp_name, &fd_info->component_name);
    FREE(kcomp_name);
    if(err)
      E_RETURN(2);
  }

  // Get the fd type
  {
    char *kfd_type = join_keys(key, "Type");
    FmsInt fdt = 0;
    err = (*io->get_int)(ctx, kfd_type, &fdt);
    FREE(kfd_type);
    if(err)
      E_RETURN(3);
    fd_info->type = (FmsFieldDescriptorType)fdt;
  }
  // (There is not setter for fd_type, might not have to write or read)

  // Get FixedOrder
  {
    char *kfo = join_keys(key, "FixedOrder");
    FmsIntType type;
    FmsInt n = 0;
    err = (*io->get_typed_int_array)(ctx, kfo, &type, (void*)&fd_info->fixed_order,
                                     &n);
    FREE(kfo);
    // We know is is an array of FmsInts that is length 3
    if(err || type != FMS_UINT64 || n != 3u)
      E_RETURN(4);
  }

  // Get ndofs, no setter either, might not have to write or read
  {
    char *kndofs = join_keys(key, "NumDofs");
    err = (*io->get_int)(ctx, kndofs, &fd_info->num_dofs);
    FREE(kndofs);
    if(err)
      E_RETURN(5);
  }

  return 0;
}